

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

Node * __thiscall Fl_Preferences::Node::addChild(Node *this,char *path)

{
  char *path_00;
  Node *pNVar1;
  
  sprintf(nameBuffer,"%s/%s",this->path_,path);
  path_00 = strdup(nameBuffer);
  pNVar1 = find(this,path_00);
  free(path_00);
  this->field_0x30 = (this->field_0x30 & 0xfa) + 1;
  return pNVar1;
}

Assistant:

Fl_Preferences::Node *Fl_Preferences::Node::addChild( const char *path ) {
  sprintf( nameBuffer, "%s/%s", path_, path );
  char *name = strdup( nameBuffer );
  Node *nd = find( name );
  free( name );
  dirty_ = 1;
  updateIndex();
  return nd;
}